

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int VP8LDecodeAlphaHeader(ALPHDecoder *alph_dec,uint8_t *data,size_t data_size)

{
  int iVar1;
  VP8LDecoder *pVVar2;
  size_t in_RDX;
  VP8LDecoder *in_RSI;
  int *in_RDI;
  VP8LDecoder *dec;
  VP8LDecoder *in_stack_00000010;
  int ok;
  VP8LDecoder *in_stack_ffffffffffffffc8;
  int local_24;
  int final_width;
  
  pVVar2 = VP8LNew();
  if (pVVar2 != (VP8LDecoder *)0x0) {
    pVVar2->width = *in_RDI;
    pVVar2->height = in_RDI[1];
    pVVar2->io = (VP8Io *)(in_RDI + 8);
    pVVar2->io->opaque = in_RDI;
    pVVar2->io->width = *in_RDI;
    pVVar2->io->height = in_RDI[1];
    pVVar2->status = VP8_STATUS_OK;
    VP8LInitBitReader(&pVVar2->br,(uint8_t *)in_RSI,in_RDX);
    final_width = (int)(in_RDX >> 0x20);
    iVar1 = DecodeImageStream(data._4_4_,(int)data,data_size._4_4_,in_stack_00000010,
                              (uint32_t **)dec);
    if (iVar1 != 0) {
      if (((pVVar2->next_transform == 1) && (pVVar2->transforms[0].type == COLOR_INDEXING_TRANSFORM)
          ) && (iVar1 = Is8bOptimizable(&pVVar2->hdr), iVar1 != 0)) {
        in_RDI[0x30] = 1;
        local_24 = AllocateInternalBuffers8b(in_stack_ffffffffffffffc8);
      }
      else {
        in_RDI[0x30] = 0;
        local_24 = AllocateInternalBuffers32b(in_RSI,final_width);
      }
      if (local_24 != 0) {
        *(VP8LDecoder **)(in_RDI + 6) = pVVar2;
        return 1;
      }
    }
    VP8LDelete((VP8LDecoder *)0x1152d9);
  }
  return 0;
}

Assistant:

int VP8LDecodeAlphaHeader(ALPHDecoder* const alph_dec,
                          const uint8_t* const data, size_t data_size) {
  int ok = 0;
  VP8LDecoder* dec = VP8LNew();

  if (dec == NULL) return 0;

  assert(alph_dec != NULL);

  dec->width = alph_dec->width;
  dec->height = alph_dec->height;
  dec->io = &alph_dec->io;
  dec->io->opaque = alph_dec;
  dec->io->width = alph_dec->width;
  dec->io->height = alph_dec->height;

  dec->status = VP8_STATUS_OK;
  VP8LInitBitReader(&dec->br, data, data_size);

  if (!DecodeImageStream(alph_dec->width, alph_dec->height, /*is_level0=*/1,
                         dec, /*decoded_data=*/NULL)) {
    goto Err;
  }

  // Special case: if alpha data uses only the color indexing transform and
  // doesn't use color cache (a frequent case), we will use DecodeAlphaData()
  // method that only needs allocation of 1 byte per pixel (alpha channel).
  if (dec->next_transform == 1 &&
      dec->transforms[0].type == COLOR_INDEXING_TRANSFORM &&
      Is8bOptimizable(&dec->hdr)) {
    alph_dec->use_8b_decode = 1;
    ok = AllocateInternalBuffers8b(dec);
  } else {
    // Allocate internal buffers (note that dec->width may have changed here).
    alph_dec->use_8b_decode = 0;
    ok = AllocateInternalBuffers32b(dec, alph_dec->width);
  }

  if (!ok) goto Err;

  // Only set here, once we are sure it is valid (to avoid thread races).
  alph_dec->vp8l_dec = dec;
  return 1;

 Err:
  VP8LDelete(dec);
  return 0;
}